

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O1

float anon_unknown.dwarf_5f851::mapPointToOutside
                (PolylineSegmentedPathwaySegmentRadii *pathway,Vec3 *point)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float radius;
  float segmentDistance;
  float local_60;
  float local_5c;
  undefined8 local_58;
  float local_50;
  float local_48 [2];
  undefined8 local_40;
  undefined4 local_38;
  
  iVar1 = (*(pathway->super_SegmentedPathway).super_Pathway._vptr_Pathway[10])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_5c = 0.0;
  }
  else {
    local_60 = 3.4028235e+38;
    local_5c = 0.0;
    lVar2 = 0;
    do {
      local_48[1] = 0.0;
      local_48[0] = 0.0;
      local_58 = 0;
      local_50 = 0.0;
      local_40 = 0;
      local_38 = 0;
      (*(pathway->super_SegmentedPathway).super_Pathway._vptr_Pathway[0x13])
                (pathway,lVar2,point,local_48 + 1,&local_58,&local_40,local_48);
      fVar4 = point->x - (float)local_58;
      fVar5 = point->y - local_58._4_4_;
      fVar3 = point->z - local_50;
      fVar3 = fVar3 * fVar3 + fVar4 * fVar4 + fVar5 * fVar5;
      if (fVar3 < 0.0) {
        fVar3 = sqrtf(fVar3);
      }
      else {
        fVar3 = SQRT(fVar3);
      }
      fVar3 = fVar3 - local_48[0];
      if (fVar3 < local_60) {
        fVar5 = point->x - (float)local_58;
        fVar6 = point->y - local_58._4_4_;
        fVar4 = point->z - local_50;
        fVar4 = fVar4 * fVar4 + fVar5 * fVar5 + fVar6 * fVar6;
        local_60 = fVar3;
        local_5c = fVar3;
        if (fVar4 < 0.0) {
          sqrtf(fVar4);
        }
      }
      (*(pathway->super_SegmentedPathway).super_Pathway._vptr_Pathway[0xb])(pathway,lVar2);
      lVar2 = lVar2 + 1;
    } while (CONCAT44(extraout_var,iVar1) != lVar2);
  }
  return local_5c;
}

Assistant:

float mapPointToOutside( OpenSteer::PolylineSegmentedPathwaySegmentRadii const& pathway, OpenSteer::Vec3 const& point ) {
        PointToOutsideMapping mapping;
        OpenSteer::mapPointToPathAlike( pathway, point, mapping);
        return mapping.distancePointToPathBoundary;    
    }